

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  Array<unsigned_char,_4UL> *this;
  Array<unsigned_char,_4UL> *this_00;
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  uchar *puVar4;
  uint uVar5;
  CallConvId CVar6;
  undefined7 in_register_00000031;
  bool bVar7;
  bool bVar8;
  long lStack_50;
  RegGroup local_3e [10];
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000031,ccId);
  bVar7 = environment->_platform == kWindows;
  bVar8 = environment->_platformABI == kMSVC;
  cc->_arch = environment->_arch;
  local_3e[4] = 1;
  this = &cc->_saveRestoreRegSize;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 4);
  *puVar4 = '\x10';
  local_3e[3] = 3;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 3);
  *puVar4 = '\b';
  local_3e[2] = 2;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 2);
  *puVar4 = '\b';
  local_3e[9] = 1;
  this_00 = &cc->_saveRestoreAlignment;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 9);
  *puVar4 = '\x10';
  local_3e[8] = 3;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 8);
  *puVar4 = '\b';
  local_3e[7] = 2;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 7);
  *puVar4 = '\b';
  bVar1 = true;
  if ((environment->_arch & k32BitMask) == kUnknown) {
    local_3e[0] = k0;
    puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>(this,local_3e);
    *puVar4 = '\b';
    local_3e[5] = 0;
    puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this_00,local_3e + 5);
    uVar5 = (uint)((bVar8 || bVar7) | 0x20);
    if ((0xf7U >> ((byte)local_34 & 0x1f) & 1) == 0) {
      uVar5 = local_34 & 0xff;
    }
    *puVar4 = '\b';
    if (7 < (byte)local_34) {
      uVar5 = local_34 & 0xff;
    }
    if (uVar5 - 0x10 < 3) {
      CVar6 = (CallConvId)uVar5;
      cc->_flags = kPassFloatsByVec;
      cc->_naturalStackAlignment = '\x10';
      *(undefined8 *)(cc->_passedOrder)._data = 0xffffff0706010200;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 2) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x28) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 3) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
      (cc->_passedRegs)._data[0] = 199;
      (cc->_passedRegs)._data[1] = 0xff;
      (cc->_passedRegs)._data[2] = 0xff;
      (cc->_passedRegs)._data[3] = 0xff;
      (cc->_preservedRegs)._data[0] = 0xffff;
      uVar3 = (undefined4)(-1L << (CVar6 - 0xe & 0x3f));
LAB_0014581e:
      lStack_50 = 0x28;
    }
    else {
      if (uVar5 == 3) {
        cc->_strategy = kMaxValue;
        cc->_flags = kPassMmxByGp|kPassFloatsByVec;
        cc->_spillZoneSize = '0';
        cc->_naturalStackAlignment = '\x10';
        *(undefined8 *)(cc->_passedOrder)._data = 0xffffffff09080201;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
        (cc->_passedRegs)._data[0] = 0x306;
        (cc->_passedRegs)._data[1] = 0x3f;
        *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffff050403020100;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
        (cc->_preservedRegs)._data[0] = 0xf0f8;
        CVar6 = kVectorCall;
LAB_00145819:
        uVar3 = 0xffc0;
        goto LAB_0014581e;
      }
      if (uVar5 == 0x21) {
        cc->_strategy = kX64Windows;
        cc->_flags = kVarArgCompatible|kPassMmxByGp|kPassFloatsByVec|kIndirectVecArgs;
        cc->_spillZoneSize = ' ';
        cc->_naturalStackAlignment = '\x10';
        *(undefined8 *)(cc->_passedOrder)._data = 0xffffffff09080201;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
        (cc->_passedRegs)._data[0] = 0x306;
        (cc->_passedRegs)._data[1] = 0xf;
        *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffffffff03020100;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
        (cc->_preservedRegs)._data[0] = 0xf0f8;
        CVar6 = kMaxValue;
        goto LAB_00145819;
      }
      if (uVar5 != 0x20) {
        return 2;
      }
      cc->_flags = kVarArgCompatible|kPassMmxByXmm|kPassFloatsByVec;
      cc->_naturalStackAlignment = '\x10';
      cc->_redZoneSize = 0x80;
      *(undefined8 *)(cc->_passedOrder)._data = 0xffff090801020607;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
      (cc->_passedRegs)._data[0] = 0x3c6;
      (cc->_passedRegs)._data[1] = 0xff;
      *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
      CVar6 = kX64SystemV;
      uVar3 = 0xf038;
      lStack_50 = 0x24;
    }
    *(undefined4 *)(cc->_reserved + lStack_50 + -6) = uVar3;
    goto LAB_0014592c;
  }
  bVar2 = false;
  local_3e[1] = 0;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 1);
  *puVar4 = '\x04';
  local_3e[6] = 0;
  puVar4 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 6);
  *puVar4 = '\x04';
  (cc->_preservedRegs)._data[0] = 0xf8;
  cc->_naturalStackAlignment = '\x04';
  CVar6 = (CallConvId)local_34;
  switch(local_34 & 0xff) {
  case 0:
    break;
  case 1:
    cc->_flags = kCalleePopsStack;
    local_34 = 1;
    bVar1 = true;
    break;
  case 2:
    cc->_flags = kCalleePopsStack;
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffff0201;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 6;
    local_34 = 2;
    break;
  case 3:
    cc->_flags = kCalleePopsStack;
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffff0201;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 6;
    (cc->_passedRegs)._data[1] = 0x3f;
    *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffff050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
    local_34 = 3;
    break;
  case 4:
    if (bVar8 || bVar7) {
      cc->_flags = kCalleePopsStack;
      *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffffff01;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
      (cc->_passedRegs)._data[0] = 2;
      local_34 = 4;
    }
    else {
      local_34 = 0;
    }
    break;
  case 5:
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffffff00;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 1;
    local_34 = 5;
    break;
  case 6:
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffff0200;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 5;
    local_34 = 6;
    break;
  case 7:
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffff010200;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 7;
    local_34 = 7;
    break;
  default:
    goto switchD_001456f2_caseD_8;
  case 0x10:
  case 0x11:
  case 0x12:
    cc->_flags = kPassFloatsByVec;
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffff0706010200;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 2) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x28) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 3) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 199;
    (cc->_passedRegs)._data[1] = 0xff;
    (cc->_passedRegs)._data[2] = 0xff;
    (cc->_passedRegs)._data[3] = 0xff;
    (cc->_preservedRegs)._data[0] = 0xff;
    (cc->_preservedRegs)._data[1] = (uint)(-1L << (CVar6 - 0xe & 0x3f)) & 0xff;
    cc->_naturalStackAlignment = '\x10';
    bVar1 = false;
  }
  CVar6 = (CallConvId)local_34;
  if (bVar1) {
    *(undefined8 *)((cc->_passedOrder)._data + 3) = 0xffffffffff020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[3] = 7;
    *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffffffffff020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[1] = 7;
    *(undefined1 *)&cc->_flags = (char)cc->_flags | kPassVecByStackIfVA;
  }
  bVar2 = true;
  if (CVar6 == kCDecl) {
    *(undefined1 *)&cc->_flags = (char)cc->_flags | kVarArgCompatible;
  }
switchD_001456f2_caseD_8:
  if (!bVar2) {
    return 2;
  }
LAB_0014592c:
  cc->_id = CVar6;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  constexpr uint32_t kZax = Gp::kIdAx;
  constexpr uint32_t kZbx = Gp::kIdBx;
  constexpr uint32_t kZcx = Gp::kIdCx;
  constexpr uint32_t kZdx = Gp::kIdDx;
  constexpr uint32_t kZsp = Gp::kIdSp;
  constexpr uint32_t kZbp = Gp::kIdBp;
  constexpr uint32_t kZsi = Gp::kIdSi;
  constexpr uint32_t kZdi = Gp::kIdDi;

  bool winABI = environment.isPlatformWindows() || environment.isMSVC();

  cc.setArch(environment.arch());
  cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
  cc.setSaveRestoreRegSize(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreRegSize(RegGroup::kX86_K, 8);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreAlignment(RegGroup::kX86_K, 8);

  if (environment.is32Bit()) {
    bool isStandardCallConv = true;

    cc.setSaveRestoreRegSize(RegGroup::kGp, 4);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 4);

    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdBx, Gp::kIdSp, Gp::kIdBp, Gp::kIdSi, Gp::kIdDi));
    cc.setNaturalStackAlignment(4);

    switch (ccId) {
      case CallConvId::kCDecl:
        break;

      case CallConvId::kStdCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        break;

      case CallConvId::kFastCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        break;

      case CallConvId::kVectorCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        break;

      case CallConvId::kThisCall:
        // NOTE: Even MINGW (starting with GCC 4.7.0) now uses __thiscall on MS Windows, so we won't bail to any
        // other calling convention if __thiscall was specified.
        if (winABI) {
          cc.setFlags(CallConvFlags::kCalleePopsStack);
          cc.setPassedOrder(RegGroup::kGp, kZcx);
        }
        else {
          ccId = CallConvId::kCDecl;
        }
        break;

      case CallConvId::kRegParm1:
        cc.setPassedOrder(RegGroup::kGp, kZax);
        break;

      case CallConvId::kRegParm2:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx);
        break;

      case CallConvId::kRegParm3:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx);
        break;

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(8));
        cc.setPreservedRegs(RegGroup::kVec, Support::lsbMask<uint32_t>(8) & ~Support::lsbMask<uint32_t>(n));

        cc.setNaturalStackAlignment(16);
        isStandardCallConv = false;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }

    if (isStandardCallConv) {
      // MMX arguments is something where compiler vendors disagree. For example GCC and MSVC would pass first three
      // via registers and the rest via stack, however Clang passes all via stack. Returning MMX registers is even
      // more fun, where GCC uses MM0, but Clang uses EAX:EDX pair. I'm not sure it's something we should be worried
      // about as MMX is deprecated anyway.
      cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2);

      // Vector arguments (XMM|YMM|ZMM) are passed via registers. However, if the function is variadic then they have
      // to be passed via stack.
      cc.setPassedOrder(RegGroup::kVec, 0, 1, 2);

      // Functions with variable arguments always use stack for MM and vector arguments.
      cc.addFlags(CallConvFlags::kPassVecByStackIfVA);
    }

    if (ccId == CallConvId::kCDecl) {
      cc.addFlags(CallConvFlags::kVarArgCompatible);
    }
  }
  else {
    cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 8);

    // Preprocess the calling convention into a common id as many conventions are normally ignored even by C/C++
    // compilers and treated as `__cdecl`.
    if (shouldTreatAsCDeclIn64BitMode(ccId))
      ccId = winABI ? CallConvId::kX64Windows : CallConvId::kX64SystemV;

    switch (ccId) {
      case CallConvId::kX64SystemV: {
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByXmm    |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        cc.setRedZoneSize(128);
        cc.setPassedOrder(RegGroup::kGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kX64Windows: {
        cc.setStrategy(CallConvStrategy::kX64Windows);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kIndirectVecArgs |
                    CallConvFlags::kPassMmxByGp     |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        // Maximum 4 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(4 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kVectorCall: {
        cc.setStrategy(CallConvStrategy::kX64VectorCall);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByGp     );
        cc.setNaturalStackAlignment(16);
        // Maximum 6 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(6 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setNaturalStackAlignment(16);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);

        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(16));
        cc.setPreservedRegs(RegGroup::kVec, ~Support::lsbMask<uint32_t>(n));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }
  }

  cc.setId(ccId);
  return kErrorOk;
}